

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O1

bool chapter2::calc_elems(vector<int,_std::allocator<int>_> *ivec,int pos)

{
  iterator __position;
  ulong uVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  int local_2c;
  
  if ((uint)pos < 0x41) {
    uVar1 = (long)(ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if ((ulong)((long)uVar1 >> 2) < (ulong)(uint)pos) {
      iVar4 = (int)(uVar1 >> 2);
      iVar3 = iVar4 + 1;
      if (iVar3 <= pos) {
        iVar4 = iVar4 * 3 + 2;
        do {
          local_2c = (iVar4 * iVar3) / 2;
          __position._M_current =
               (ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (__position._M_current ==
              (ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (ivec,__position,&local_2c);
          }
          else {
            *__position._M_current = local_2c;
            (ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
          iVar3 = iVar3 + 1;
          iVar4 = iVar4 + 3;
        } while (iVar3 <= pos);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Sorry, invalid position.",0x18);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,pos);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  return (uint)pos < 0x41;
}

Assistant:

bool calc_elems(vector<int> &ivec, int pos) {
        if (pos < 0 || pos > 64) {
            cerr << "Sorry, invalid position." << pos << endl;
            return false;
        }

        if (ivec.size() < pos) {
            really_calc_elems(ivec, pos);
        }
        return true;
    }